

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int uv_async_init(uv_loop_t *loop,uv_async_t *handle,uv_async_cb async_cb)

{
  int err;
  uv_async_cb async_cb_local;
  uv_async_t *handle_local;
  uv_loop_t *loop_local;
  
  loop_local._4_4_ = uv__async_start(loop);
  if (loop_local._4_4_ == 0) {
    handle->loop = loop;
    handle->type = UV_ASYNC;
    handle->flags = 8;
    uv__queue_insert_tail(&loop->handle_queue,&handle->handle_queue);
    handle->next_closing = (uv_handle_t *)0x0;
    handle->async_cb = async_cb;
    handle->pending = 0;
    (handle->u).fd = 0;
    uv__queue_insert_tail(&loop->async_handles,&handle->queue);
    if (((handle->flags & 4) == 0) && (handle->flags = handle->flags | 4, (handle->flags & 8) != 0))
    {
      handle->loop->active_handles = handle->loop->active_handles + 1;
    }
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_async_init(uv_loop_t* loop, uv_async_t* handle, uv_async_cb async_cb) {
  int err;

  err = uv__async_start(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*)handle, UV_ASYNC);
  handle->async_cb = async_cb;
  handle->pending = 0;
  handle->u.fd = 0; /* This will be used as a busy flag. */

  uv__queue_insert_tail(&loop->async_handles, &handle->queue);
  uv__handle_start(handle);

  return 0;
}